

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<int>::Walker(Walker<int> *this)

{
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Walker_00915c50;
  this_00 = (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<int>,std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>>::
  stack<std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>,void>(this_00);
  in_RDI[1] = this_00;
  *(undefined1 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new std::stack<WalkState<T> >;
  stopped_early_ = false;
}